

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::EndColumns(void)

{
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiOldColumns *pIVar4;
  ImGuiOldColumns *pIVar5;
  ImGuiOldColumnData *pIVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  ImU32 col;
  int iVar13;
  ulong uVar14;
  ImVec2 *p1;
  ImGuiCol idx;
  int column_index;
  ImGuiContext *g;
  long lVar15;
  ImGuiID id;
  ulong uVar16;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar17 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar29 [48];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  float fVar30;
  float fVar31;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  bool local_9a;
  bool local_99;
  uint local_98;
  float local_94;
  ulong local_90;
  float local_84;
  ImGuiContext *local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImRect local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 auVar18 [32];
  undefined1 auVar28 [64];
  
  pIVar11 = GImGui;
  auVar29 = in_ZmmResult._16_48_;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  pIVar4 = (pIVar3->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar4->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge(&pIVar4->Splitter,pIVar3->DrawList);
  }
  fVar31 = (pIVar3->DC).CursorPos.y;
  local_98 = pIVar4->Flags;
  uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar31),ZEXT416((uint)pIVar4->LineMaxY),2);
  bVar12 = (bool)((byte)uVar7 & 1);
  auVar22._16_48_ = auVar29;
  auVar22._0_16_ = ZEXT416((uint)fVar31);
  auVar21._4_60_ = auVar22._4_60_;
  auVar21._0_4_ = (float)((uint)bVar12 * (int)pIVar4->LineMaxY + (uint)!bVar12 * (int)fVar31);
  pIVar4->LineMaxY = auVar21._0_4_;
  (pIVar3->DC).CursorPos.y = auVar21._0_4_;
  if ((local_98 & 0x10) == 0) {
    (pIVar3->DC).CursorMaxPos.x = pIVar4->HostCursorMaxPosX;
  }
  if ((((local_98 & 1) == 0) && (pIVar3->SkipItems == false)) && (1 < pIVar4->Count)) {
    fVar31 = (pIVar3->ClipRect).Min.y;
    uVar14 = 1;
    local_80 = pIVar11;
    lVar15 = 0;
    local_90 = 0xffffffff;
    uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar31),ZEXT416((uint)pIVar4->HostCursorPosY),2);
    bVar12 = (bool)((byte)uVar7 & 1);
    auVar23._16_48_ = auVar29;
    auVar23._0_16_ = ZEXT416((uint)fVar31);
    auVar24._4_60_ = auVar23._4_60_;
    auVar24._0_4_ =
         (float)((uint)bVar12 * (int)pIVar4->HostCursorPosY + (uint)!bVar12 * (int)fVar31);
    local_58 = auVar24._0_16_;
    local_84 = auVar24._0_4_ + 1.0;
    auVar17 = vminss_avx(auVar21._0_16_,ZEXT416((uint)(pIVar3->ClipRect).Max.y));
    local_94 = auVar17._0_4_;
    do {
      pIVar5 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar5 == (ImGuiOldColumns *)0x0) {
        local_68.Max.x = 0.0;
      }
      else {
        auVar17 = vfmadd132ss_fma(ZEXT416((uint)(pIVar5->OffMaxX - pIVar5->OffMinX)),
                                  ZEXT416((uint)pIVar5->OffMinX),
                                  ZEXT416(*(uint *)((long)&(pIVar5->Columns).Data[1].OffsetNorm +
                                                   lVar15)));
        local_68.Max.x = auVar17._0_4_;
      }
      local_68.Max.x = local_68.Max.x + (pIVar3->Pos).x;
      pIVar6 = (pIVar4->Columns).Data;
      local_68.Min.x = local_68.Max.x + -4.0;
      uVar16 = pIVar4->ID + uVar14;
      id = (ImGuiID)uVar16;
      _local_48 = ZEXT416((uint)local_68.Max.x);
      local_68.Max.x = local_68.Max.x + 4.0;
      local_68.Min.y = (float)local_58._0_4_;
      local_68.Max.y = local_94;
      KeepAliveID(id);
      p1 = (ImVec2 *)(uVar16 & 0xffffffff);
      bVar12 = IsClippedEx(&local_68,id);
      if (!bVar12) {
        local_99 = false;
        local_9a = false;
        if ((local_98 & 2) == 0) {
          ButtonBehavior(&local_68,id,&local_99,&local_9a,0);
          if (local_99 == false) {
            if ((local_9a & 1U) != 0) {
              local_80->MouseCursor = 4;
              goto LAB_002e4308;
            }
          }
          else {
            local_80->MouseCursor = 4;
            if ((local_9a & 1U) != 0) {
LAB_002e4308:
              if ((*(byte *)((long)&pIVar6[1].Flags + lVar15) & 2) == 0) {
                local_90 = uVar14;
              }
              local_90 = local_90 & 0xffffffff;
            }
          }
        }
        idx = local_99 + 0x1b;
        if ((local_9a & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        auVar17._0_4_ = (int)(float)local_48._0_4_;
        auVar17._4_4_ = (int)(float)local_48._4_4_;
        auVar17._8_4_ = (int)fStack_40;
        auVar17._12_4_ = (int)fStack_3c;
        p1 = &local_70;
        auVar17 = vcvtdq2ps_avx(auVar17);
        local_78.x = auVar17._0_4_;
        local_70.y = local_84;
        local_78.y = local_94;
        local_70.x = local_78.x;
        ImDrawList::AddLine(pIVar3->DrawList,p1,&local_78,col,1.0);
      }
      auVar29 = auVar24._16_48_;
      uVar2 = pIVar4->Count;
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x1c;
    } while ((long)uVar14 < (long)(int)uVar2);
    column_index = (int)local_90;
    if (column_index != -1) {
      if ((-1 < (int)uVar2) && (pIVar4->IsBeingResized == false)) {
        auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar23 = vpbroadcastq_avx512f(ZEXT816(0x1c));
        auVar24 = vpbroadcastq_avx512f(ZEXT816(0x10));
        pIVar6 = (pIVar4->Columns).Data;
        auVar25 = vpbroadcastq_avx512f();
        lVar15 = (ulong)(uVar2 & 0x7ffffff0) + 0x10;
        do {
          auVar26 = vpmullq_avx512dq(auVar21,auVar23);
          uVar16 = vpcmpuq_avx512f(auVar21,auVar25,2);
          auVar27 = vpmullq_avx512dq(auVar22,auVar23);
          uVar8 = vpcmpuq_avx512f(auVar22,auVar25,2);
          auVar22 = vpaddq_avx512f(auVar22,auVar24);
          auVar21 = vpaddq_avx512f(auVar21,auVar24);
          lVar15 = lVar15 + -0x10;
          auVar28._32_32_ = auVar21._32_32_;
          auVar18 = vgatherqps_avx512f(*(undefined8 *)((long)&p1->x + (long)&pIVar6->OffsetNorm));
          auVar19._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * auVar18._8_8_;
          auVar19._0_8_ = (ulong)((byte)uVar16 & 1) * auVar18._0_8_;
          auVar19._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * auVar18._16_8_;
          auVar19._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * auVar18._24_8_;
          auVar18 = vgatherqps_avx512f(*(undefined8 *)((long)&pIVar6->OffsetNorm + uVar14));
          auVar20._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar18._8_8_;
          auVar20._0_8_ = (ulong)((byte)uVar8 & 1) * auVar18._0_8_;
          auVar20._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar18._16_8_;
          auVar20._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar18._24_8_;
          auVar28._0_32_ = auVar20;
          auVar29 = auVar28._16_48_;
          vscatterqps_avx512f(ZEXT864(pIVar6) + ZEXT864(4) + auVar27,uVar8,auVar20);
          vscatterqps_avx512f(ZEXT864(pIVar6) + ZEXT864(4) + auVar26,uVar16,auVar19);
        } while (lVar15 != 0);
      }
      pIVar4->IsBeingResized = true;
      fVar31 = (((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0) -
               (GImGui->CurrentWindow->Pos).x;
      pIVar5 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar5 == (ImGuiOldColumns *)0x0) {
        fVar30 = 0.0;
      }
      else {
        if (column_index < 1) {
          iVar13 = pIVar5->Current;
        }
        else {
          iVar13 = column_index + -1;
        }
        auVar17 = vfmadd132ss_fma(ZEXT416((uint)(pIVar5->OffMaxX - pIVar5->OffMinX)),
                                  ZEXT416((uint)pIVar5->OffMinX),
                                  ZEXT416((uint)(pIVar5->Columns).Data[iVar13].OffsetNorm));
        fVar30 = auVar17._0_4_;
      }
      fVar1 = (GImGui->Style).ColumnsMinSpacing;
      fVar30 = fVar30 + fVar1;
      uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar30),ZEXT416((uint)fVar31),2);
      bVar12 = (bool)((byte)uVar7 & 1);
      auVar26._16_48_ = auVar29;
      auVar26._0_16_ = ZEXT416((uint)fVar30);
      auVar25._4_60_ = auVar26._4_60_;
      auVar25._0_4_ = (uint)bVar12 * (int)fVar31 + (uint)!bVar12 * (int)fVar30;
      auVar17 = auVar25._0_16_;
      if ((pIVar4->Flags & 4) != 0) {
        if (pIVar5 == (ImGuiOldColumns *)0x0) {
          fVar31 = 0.0;
        }
        else {
          if (column_index < -1) {
            iVar13 = pIVar5->Current;
          }
          else {
            iVar13 = column_index + 1;
          }
          auVar9 = vfmadd132ss_fma(ZEXT416((uint)(pIVar5->OffMaxX - pIVar5->OffMinX)),
                                   ZEXT416((uint)pIVar5->OffMinX),
                                   ZEXT416((uint)(pIVar5->Columns).Data[iVar13].OffsetNorm));
          fVar31 = auVar9._0_4_;
        }
        auVar17 = vminss_avx(auVar17,ZEXT416((uint)(fVar31 - fVar1)));
      }
      bVar12 = column_index != -1;
      SetColumnOffset(column_index,auVar17._0_4_);
      goto LAB_002e44ad;
    }
  }
  bVar12 = false;
LAB_002e44ad:
  pIVar4->IsBeingResized = bVar12;
  IVar10 = (pIVar3->ParentWorkRect).Max;
  (pIVar3->WorkRect).Min = (pIVar3->ParentWorkRect).Min;
  (pIVar3->WorkRect).Max = IVar10;
  IVar10 = (pIVar4->HostBackupParentWorkRect).Max;
  (pIVar3->ParentWorkRect).Min = (pIVar4->HostBackupParentWorkRect).Min;
  (pIVar3->ParentWorkRect).Max = IVar10;
  (pIVar3->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar3->DC).ColumnsOffset.x = 0.0;
  auVar17 = vcvtdq2ps_avx(ZEXT416((uint)(int)((pIVar3->Pos).x + (pIVar3->DC).Indent.x + 0.0)));
  (pIVar3->DC).CursorPos.x = auVar17._0_4_;
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id)) // FIXME: Can be removed or replaced with a lower-level test
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}